

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::objectivec::ParseSimpleStream
               (ZeroCopyInputStream *input_stream,string *stream_name,LineConsumer *line_consumer,
               string *out_error)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  string local_f8;
  undefined4 local_d4;
  string local_d0;
  StringPiece local_b0;
  int local_9c;
  char *pcStack_98;
  int buf_len;
  void *buf;
  undefined1 local_80 [8];
  Parser parser;
  string local_error;
  string *out_error_local;
  LineConsumer *line_consumer_local;
  string *stream_name_local;
  ZeroCopyInputStream *input_stream_local;
  
  std::__cxx11::string::string((string *)(parser.leftover_.field_2._M_local_buf + 8));
  anon_unknown_0::Parser::Parser((Parser *)local_80,line_consumer);
  do {
    do {
      uVar2 = (*input_stream->_vptr_ZeroCopyInputStream[2])
                        (input_stream,&stack0xffffffffffffff68,&local_9c);
      if ((uVar2 & 1) == 0) {
        bVar1 = anon_unknown_0::Parser::Finish
                          ((Parser *)local_80,(string *)((long)&parser.leftover_.field_2 + 8));
        if (bVar1) {
          input_stream_local._7_1_ = true;
        }
        else {
          iVar3 = anon_unknown_0::Parser::last_line((Parser *)local_80);
          anon_unknown_0::FullErrorString
                    (&local_f8,stream_name,iVar3,(string *)((long)&parser.leftover_.field_2 + 8));
          std::__cxx11::string::operator=((string *)out_error,(string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_f8);
          input_stream_local._7_1_ = false;
        }
        goto LAB_004bd415;
      }
    } while (local_9c == 0);
    stringpiece_internal::StringPiece::StringPiece(&local_b0,pcStack_98,(long)local_9c);
    bVar1 = anon_unknown_0::Parser::ParseChunk
                      ((Parser *)local_80,local_b0,(string *)((long)&parser.leftover_.field_2 + 8));
  } while (((bVar1 ^ 0xffU) & 1) == 0);
  iVar3 = anon_unknown_0::Parser::last_line((Parser *)local_80);
  anon_unknown_0::FullErrorString
            (&local_d0,stream_name,iVar3,(string *)((long)&parser.leftover_.field_2 + 8));
  std::__cxx11::string::operator=((string *)out_error,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  input_stream_local._7_1_ = false;
LAB_004bd415:
  local_d4 = 1;
  anon_unknown_0::Parser::~Parser((Parser *)local_80);
  std::__cxx11::string::~string((string *)(parser.leftover_.field_2._M_local_buf + 8));
  return input_stream_local._7_1_;
}

Assistant:

bool ParseSimpleStream(io::ZeroCopyInputStream& input_stream,
                       const std::string& stream_name,
                       LineConsumer* line_consumer,
                       std::string* out_error) {
  std::string local_error;
  Parser parser(line_consumer);
  const void* buf;
  int buf_len;
  while (input_stream.Next(&buf, &buf_len)) {
    if (buf_len == 0) {
      continue;
    }

    if (!parser.ParseChunk(StringPiece(static_cast<const char*>(buf), buf_len),
                           &local_error)) {
      *out_error = FullErrorString(stream_name, parser.last_line(), local_error);
      return false;
    }
  }
  if (!parser.Finish(&local_error)) {
    *out_error = FullErrorString(stream_name, parser.last_line(), local_error);
    return false;
  }
  return true;
}